

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O1

REF_STATUS ref_layer_insert(REF_LAYER ref_layer,REF_GRID ref_grid)

{
  REF_INT RVar1;
  REF_INT RVar2;
  REF_INT *pRVar3;
  REF_DBL *pRVar4;
  REF_DBL *pRVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  undefined8 uVar9;
  REF_NODE ref_node;
  int iVar10;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  long lVar14;
  bool bVar15;
  double dVar16;
  REF_INT new_node;
  REF_BOOL has_support;
  REF_INT tet;
  REF_GLOB global;
  REF_DBL bary [4];
  REF_INT nodes [27];
  REF_INT local_120;
  int local_11c;
  REF_NODE local_118;
  REF_INT local_110;
  REF_INT local_10c;
  long local_108;
  long local_100;
  long local_f8;
  REF_CELL local_f0;
  REF_DBL local_e8 [5];
  REF_NODE local_c0;
  REF_LAYER local_b8;
  long local_b0;
  REF_INT local_a8 [30];
  
  ref_node = ref_layer->ref_grid->node;
  lVar11 = (long)ref_layer->nnode_per_layer;
  if (0 < lVar11) {
    local_118 = ref_grid->node;
    local_f0 = ref_grid->cell[8];
    local_f8 = lVar11 * 0x78;
    lVar14 = 0;
    local_108 = lVar11;
    local_c0 = ref_node;
    local_b8 = ref_layer;
    do {
      local_100 = -1;
      if ((lVar14 < ref_node->max) && (local_100 = ref_node->global[lVar14], local_100 < 0)) {
        local_100 = -1;
      }
      local_10c = -1;
      if ((-1 < local_100) && (local_100 < local_f0->ref_adj->nnode)) {
        local_10c = local_f0->ref_adj->first[local_100];
      }
      local_b0 = local_108 + lVar14;
      uVar7 = ref_grid_enclosing_tet(ref_grid,ref_node->real + local_b0 * 0xf,&local_10c,local_e8);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0xe7,"ref_layer_insert",(ulong)uVar7,"enclosing tet");
        return uVar7;
      }
      uVar7 = ref_cell_nodes(local_f0,local_10c,local_a8);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0xe8,"ref_layer_insert",(ulong)uVar7,"nodes");
        return uVar7;
      }
      lVar11 = 0;
      iVar10 = 0;
      do {
        dVar16 = local_e8[lVar11];
        if (dVar16 <= -dVar16) {
          dVar16 = -dVar16;
        }
        iVar10 = iVar10 + (uint)(dVar16 < 1e-10);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      local_120 = -1;
      if (iVar10 != 2) {
        if (iVar10 == 1) {
          iVar10 = -1;
          lVar11 = 0;
          do {
            dVar16 = local_e8[lVar11];
            if (dVar16 <= -dVar16) {
              dVar16 = -dVar16;
            }
            if (dVar16 < 1e-10) {
              if (iVar10 != -1) {
                pcVar13 = "more zeros than nodes";
                uVar9 = 0x11b;
                goto LAB_0020f56e;
              }
              iVar10 = (int)lVar11;
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 != 4);
          if (iVar10 == -1) {
            pcVar13 = "non-zero node0 missing";
            uVar9 = 0x11d;
            goto LAB_0020f56e;
          }
          pRVar3 = local_f0->f2n;
          RVar1 = local_a8[pRVar3[iVar10 * 4]];
          RVar2 = local_a8[pRVar3[iVar10 * 4 + 1]];
          local_110 = local_a8[pRVar3[iVar10 * 4 + 2]];
          uVar7 = ref_geom_supported(ref_grid->geom,RVar1,&local_11c);
          if (uVar7 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                   ,0x125,"ref_layer_insert",(ulong)uVar7,"got geom?");
            return uVar7;
          }
          if (local_11c == 0) {
            uVar7 = ref_geom_supported(ref_grid->geom,RVar2,&local_11c);
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                     ,0x128,"ref_layer_insert",(ulong)uVar7,"got geom?");
              return uVar7;
            }
            if (local_11c == 0) {
              uVar7 = ref_geom_supported(ref_grid->geom,local_110,&local_11c);
              if (uVar7 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                       ,299,"ref_layer_insert",(ulong)uVar7,"got geom?");
                return uVar7;
              }
              if (local_11c == 0) {
                uVar7 = ref_node_next_global(local_118,&local_100);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x12d,"ref_layer_insert",(ulong)uVar7,"next global");
                  return uVar7;
                }
                uVar7 = ref_node_add(local_118,local_100,&local_120);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x12e,"ref_layer_insert",(ulong)uVar7,"new node");
                  return uVar7;
                }
                uVar7 = ref_node_interpolate_face(local_118,RVar1,RVar2,local_110,local_120);
                ref_node = local_c0;
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x130,"ref_layer_insert",(ulong)uVar7,"interp new node");
                  return uVar7;
                }
                pRVar4 = local_118->real;
                pRVar5 = local_c0->real;
                lVar11 = 0;
                do {
                  pRVar4[(long)local_120 * 0xf + lVar11] =
                       *(REF_DBL *)((long)pRVar5 + lVar11 * 8 + local_f8);
                  lVar11 = lVar11 + 1;
                } while (lVar11 != 3);
                uVar7 = ref_split_face(ref_grid,RVar1,RVar2,local_110,local_120);
                ref_layer = local_b8;
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c"
                         ,0x134,"ref_layer_insert",(ulong)uVar7,"fsplit");
                  return uVar7;
                }
                if (local_b8->verbose != 0) {
                  printf("split zeros %d bary %f %f %f %f\n",local_e8[0],local_e8[1],local_e8[2],
                         local_e8[3],1);
                }
                goto LAB_0020f466;
              }
              pcVar13 = "add geometry handling";
              uVar9 = 300;
            }
            else {
              pcVar13 = "add geometry handling";
              uVar9 = 0x129;
            }
          }
          else {
            pcVar13 = "add geometry handling";
            uVar9 = 0x126;
          }
        }
        else {
          if (ref_layer->verbose != 0) {
            printf("implement zeros %d bary %f %f %f %f\n",local_e8[0],local_e8[1],local_e8[2],
                   local_e8[3]);
          }
          pcVar13 = "missing a general case";
          uVar9 = 0x13d;
        }
        goto LAB_0020f740;
      }
      iVar8 = -1;
      lVar11 = 0;
      iVar10 = -1;
      do {
        dVar16 = local_e8[lVar11];
        if (dVar16 <= -dVar16) {
          dVar16 = -dVar16;
        }
        iVar6 = iVar8;
        if (((1e-10 <= dVar16) && (iVar6 = (int)lVar11, iVar8 != -1)) &&
           (bVar15 = iVar10 != -1, iVar6 = iVar8, iVar10 = (int)lVar11, bVar15)) {
          pcVar13 = "more non-zeros than nodes";
          uVar9 = 0xfb;
          goto LAB_0020f56e;
        }
        iVar8 = iVar6;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      if (iVar8 == -1) {
        pcVar13 = "non-zero node0 missing";
        uVar9 = 0xfd;
        goto LAB_0020f56e;
      }
      if (iVar10 == -1) {
        pcVar13 = "non-zero node1 missing";
        uVar9 = 0xfe;
        goto LAB_0020f56e;
      }
      RVar1 = local_a8[iVar8];
      RVar2 = local_a8[iVar10];
      uVar7 = ref_geom_supported(ref_grid->geom,RVar2,&local_11c);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x102,"ref_layer_insert",(ulong)uVar7,"got geom?");
        return uVar7;
      }
      if (local_11c != 0) {
        pcVar13 = "add geometry handling";
        uVar9 = 0x103;
LAB_0020f740:
        uVar7 = 6;
        uVar12 = 6;
        goto LAB_0020f746;
      }
      uVar7 = ref_geom_supported(ref_grid->geom,RVar1,&local_11c);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x105,"ref_layer_insert",(ulong)uVar7,"got geom?");
        return uVar7;
      }
      if (local_11c != 0) {
        pcVar13 = "add geometry handling";
        uVar9 = 0x106;
        goto LAB_0020f740;
      }
      uVar7 = ref_node_next_global(local_118,&local_100);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x107,"ref_layer_insert",(ulong)uVar7,"next global");
        return uVar7;
      }
      uVar7 = ref_node_add(local_118,local_100,&local_120);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x108,"ref_layer_insert",(ulong)uVar7,"new node");
        return uVar7;
      }
      uVar7 = ref_node_interpolate_edge(local_118,RVar1,RVar2,0.5,local_120);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x10a,"ref_layer_insert",(ulong)uVar7,"interp new node");
        return uVar7;
      }
      uVar7 = ref_geom_add_between(ref_grid,RVar1,RVar2,0.5,local_120);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x10c,"ref_layer_insert",(ulong)uVar7,"geom new node");
        return uVar7;
      }
      uVar7 = ref_geom_constrain(ref_grid,local_120);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x10d,"ref_layer_insert",(ulong)uVar7,"geom constraint");
        return uVar7;
      }
      uVar7 = ref_split_edge(ref_grid,RVar1,RVar2,local_120);
      if (uVar7 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x10e,"ref_layer_insert",(ulong)uVar7,"split");
        return uVar7;
      }
      pRVar4 = local_118->real;
      pRVar5 = local_c0->real;
      lVar11 = 0;
      do {
        pRVar4[(long)local_120 * 0xf + lVar11] = *(REF_DBL *)((long)pRVar5 + lVar11 * 8 + local_f8);
        lVar11 = lVar11 + 1;
        ref_node = local_c0;
        ref_layer = local_b8;
      } while (lVar11 != 3);
LAB_0020f466:
      if ((long)local_120 == -1) {
        pcVar13 = "new_node not set";
        uVar9 = 0x140;
LAB_0020f56e:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               uVar9,"ref_layer_insert",pcVar13);
        return 1;
      }
      ref_node->global[local_b0] = (long)local_120;
      if ((ref_layer->verbose != 0) && (uVar7 = ref_validation_cell_volume(ref_grid), uVar7 != 0)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x143,"ref_layer_insert",(ulong)uVar7,"vol");
        return uVar7;
      }
      lVar14 = lVar14 + 1;
      local_f8 = local_f8 + 0x78;
    } while (lVar14 != local_108);
  }
  uVar7 = ref_node_rebuild_sorted_global(ref_node);
  if (uVar7 == 0) {
    uVar7 = 0;
  }
  else {
    pcVar13 = "rebuild";
    uVar9 = 0x146;
    uVar12 = (ulong)uVar7;
LAB_0020f746:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",uVar9,
           "ref_layer_insert",uVar12,pcVar13);
  }
  return uVar7;
}

Assistant:

REF_FCN REF_STATUS ref_layer_insert(REF_LAYER ref_layer, REF_GRID ref_grid) {
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_NODE layer_node = ref_grid_node(ref_layer_grid(ref_layer));
  REF_INT nnode_per_layer, node, local;
  REF_GLOB global;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER], node0, node1, node2, node3;
  REF_INT tet, i, new_node;
  REF_DBL bary[4];
  REF_INT zeros;
  REF_DBL zero_tol = 1.0e-10;
  REF_BOOL has_support;

  nnode_per_layer = ref_layer->nnode_per_layer;

  for (node = 0; node < nnode_per_layer; node++) {
    global = ref_node_global(layer_node, node); /* base */
    tet = ref_adj_first(ref_cell_adj(ref_cell), global);
    local = node + nnode_per_layer; /* target */
    RSS(ref_grid_enclosing_tet(ref_grid, ref_node_xyz_ptr(layer_node, local),
                               &tet, bary),
        "enclosing tet");
    RSS(ref_cell_nodes(ref_cell, tet, nodes), "nodes");
    zeros = 0;
    for (i = 0; i < 4; i++)
      if (ABS(bary[i]) < zero_tol) zeros++;
    new_node = REF_EMPTY;
    switch (zeros) {
      case 2: /* split an edge */
        node0 = REF_EMPTY;
        node1 = REF_EMPTY;
        for (i = 0; i < 4; i++)
          if (ABS(bary[i]) >= zero_tol) {
            if (node0 == REF_EMPTY) {
              node0 = i;
              continue;
            }
            if (node1 == REF_EMPTY) {
              node1 = i;
              continue;
            }
            THROW("more non-zeros than nodes");
          }
        if (node0 == REF_EMPTY) THROW("non-zero node0 missing");
        if (node1 == REF_EMPTY) THROW("non-zero node1 missing");
        node0 = nodes[node0];
        node1 = nodes[node1];
        RSS(ref_geom_supported(ref_grid_geom(ref_grid), node1, &has_support),
            "got geom?");
        if (has_support) RSS(REF_IMPLEMENT, "add geometry handling");
        RSS(ref_geom_supported(ref_grid_geom(ref_grid), node0, &has_support),
            "got geom?");
        if (has_support) RSS(REF_IMPLEMENT, "add geometry handling");
        RSS(ref_node_next_global(ref_node, &global), "next global");
        RSS(ref_node_add(ref_node, global, &new_node), "new node");
        RSS(ref_node_interpolate_edge(ref_node, node0, node1, 0.5, new_node),
            "interp new node");
        RSS(ref_geom_add_between(ref_grid, node0, node1, 0.5, new_node),
            "geom new node");
        RSS(ref_geom_constrain(ref_grid, new_node), "geom constraint");
        RSS(ref_split_edge(ref_grid, node0, node1, new_node), "split");
        for (i = 0; i < 3; i++)
          ref_node_xyz(ref_node, i, new_node) =
              ref_node_xyz(layer_node, i, local);
        break;
      case 1: /* split a triangular face*/
        node0 = REF_EMPTY;
        for (i = 0; i < 4; i++)
          if (ABS(bary[i]) < zero_tol) {
            if (node0 == REF_EMPTY) {
              node0 = i;
              continue;
            }
            THROW("more zeros than nodes");
          }
        if (node0 == REF_EMPTY) THROW("non-zero node0 missing");
        node1 = ref_cell_f2n_gen(ref_cell, 0, node0);
        node2 = ref_cell_f2n_gen(ref_cell, 1, node0);
        node3 = ref_cell_f2n_gen(ref_cell, 2, node0);
        node1 = nodes[node1];
        node2 = nodes[node2];
        node3 = nodes[node3];
        RSS(ref_geom_supported(ref_grid_geom(ref_grid), node1, &has_support),
            "got geom?");
        if (has_support) RSS(REF_IMPLEMENT, "add geometry handling");
        RSS(ref_geom_supported(ref_grid_geom(ref_grid), node2, &has_support),
            "got geom?");
        if (has_support) RSS(REF_IMPLEMENT, "add geometry handling");
        RSS(ref_geom_supported(ref_grid_geom(ref_grid), node3, &has_support),
            "got geom?");
        if (has_support) RSS(REF_IMPLEMENT, "add geometry handling");
        RSS(ref_node_next_global(ref_node, &global), "next global");
        RSS(ref_node_add(ref_node, global, &new_node), "new node");
        RSS(ref_node_interpolate_face(ref_node, node1, node2, node3, new_node),
            "interp new node");
        for (i = 0; i < 3; i++)
          ref_node_xyz(ref_node, i, new_node) =
              ref_node_xyz(layer_node, i, local);
        RSS(ref_split_face(ref_grid, node1, node2, node3, new_node), "fsplit");
        if (ref_layer->verbose)
          printf("split zeros %d bary %f %f %f %f\n", zeros, bary[0], bary[1],
                 bary[2], bary[3]);
        break;
      default:
        if (ref_layer->verbose)
          printf("implement zeros %d bary %f %f %f %f\n", zeros, bary[0],
                 bary[1], bary[2], bary[3]);
        RSS(REF_IMPLEMENT, "missing a general case");
        break;
    }
    RAS(REF_EMPTY != new_node, "new_node not set");
    layer_node->global[local] = new_node;

    if (ref_layer->verbose) RSS(ref_validation_cell_volume(ref_grid), "vol");
  }

  RSS(ref_node_rebuild_sorted_global(layer_node), "rebuild");

  return REF_SUCCESS;
}